

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.cpp
# Opt level: O0

glsl_type *
array_sizing_visitor::resize_interface_members
          (glsl_type *type,int *max_ifc_array_access,bool is_ssbo)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  glsl_type *pgVar4;
  glsl_struct_field *local_68;
  glsl_type *new_ifc_type;
  bool row_major;
  glsl_interface_packing packing;
  bool implicit_sized_array;
  uint i;
  glsl_struct_field *local_28;
  glsl_struct_field *fields;
  uint num_fields;
  bool is_ssbo_local;
  int *max_ifc_array_access_local;
  glsl_type *type_local;
  
  fields._0_4_ = type->length;
  uVar2 = CONCAT44(0,(glsl_interface_packing)fields);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x30),0);
  if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  fields._7_1_ = is_ssbo;
  _num_fields = max_ifc_array_access;
  max_ifc_array_access_local = (int *)type;
  local_28 = (glsl_struct_field *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_68 = local_28;
    do {
      glsl_struct_field::glsl_struct_field(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != local_28 + uVar2);
  }
  memcpy(local_28,*(void **)(max_ifc_array_access_local + 8),
         (ulong)(glsl_interface_packing)fields * 0x30);
  for (packing = GLSL_INTERFACE_PACKING_STD140; packing < (glsl_interface_packing)fields;
      packing = packing + GLSL_INTERFACE_PACKING_SHARED) {
    row_major = ((byte)local_28[packing].field_0x28 >> 1 & 1) != 0;
    if (((fields._7_1_ & 1) == 0) ||
       (packing != (glsl_interface_packing)fields - GLSL_INTERFACE_PACKING_SHARED)) {
      fixup_type(&local_28[packing].type,_num_fields[packing],false,&row_major);
    }
    else {
      fixup_type(&local_28[packing].type,_num_fields[packing],true,&row_major);
    }
    local_28[packing].field_0x28 = local_28[packing].field_0x28 & 0xfd | (row_major & 1U) << 1;
  }
  pgVar4 = glsl_type::get_interface_instance
                     (local_28,(glsl_interface_packing)fields,
                      (uint)max_ifc_array_access_local[1] >> 0x16 & GLSL_INTERFACE_PACKING_STD430,
                      ((uint)max_ifc_array_access_local[1] >> 0x18 & 1) != 0,
                      *(char **)(max_ifc_array_access_local + 4));
  if (local_28 != (glsl_struct_field *)0x0) {
    operator_delete__(local_28);
  }
  return pgVar4;
}

Assistant:

static const glsl_type *
   resize_interface_members(const glsl_type *type,
                            const int *max_ifc_array_access,
                            bool is_ssbo)
   {
      unsigned num_fields = type->length;
      glsl_struct_field *fields = new glsl_struct_field[num_fields];
      memcpy(fields, type->fields.structure,
             num_fields * sizeof(*fields));
      for (unsigned i = 0; i < num_fields; i++) {
         bool implicit_sized_array = fields[i].implicit_sized_array;
         /* If SSBO last member is unsized array, we don't replace it by a sized
          * array.
          */
         if (is_ssbo && i == (num_fields - 1))
            fixup_type(&fields[i].type, max_ifc_array_access[i],
                       true, &implicit_sized_array);
         else
            fixup_type(&fields[i].type, max_ifc_array_access[i],
                       false, &implicit_sized_array);
         fields[i].implicit_sized_array = implicit_sized_array;
      }
      glsl_interface_packing packing =
         (glsl_interface_packing) type->interface_packing;
      bool row_major = (bool) type->interface_row_major;
      const glsl_type *new_ifc_type =
         glsl_type::get_interface_instance(fields, num_fields,
                                           packing, row_major, type->name);
      delete [] fields;
      return new_ifc_type;
   }